

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::JsRTCodeParseAction_UnloadEventMemory
               (EventLogEntry *evt,UnlinkableSlabAllocator *alloc)

{
  bool bVar1;
  JsRTCodeParseAction *pJVar2;
  JsRTCodeParseAction *cpAction;
  UnlinkableSlabAllocator *alloc_local;
  EventLogEntry *evt_local;
  
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCodeParseAction,(TTD::NSLogEvents::EventKind)67>
                     (evt);
  SlabAllocatorBase<8>::UnlinkAllocation(alloc,pJVar2->SourceCode);
  bVar1 = IsNullPtrTTString(&pJVar2->SourceUri);
  if (!bVar1) {
    SlabAllocatorBase<8>::UnlinkString(alloc,&pJVar2->SourceUri);
  }
  return;
}

Assistant:

void JsRTCodeParseAction_UnloadEventMemory(EventLogEntry* evt, UnlinkableSlabAllocator& alloc)
        {
            JsRTCodeParseAction* cpAction = GetInlineEventDataAs<JsRTCodeParseAction, EventKind::CodeParseActionTag>(evt);

            alloc.UnlinkAllocation(cpAction->SourceCode);

            if(!IsNullPtrTTString(cpAction->SourceUri))
            {
                alloc.UnlinkString(cpAction->SourceUri);
            }
        }